

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool ReadLinsData(string *DataFile,VecVector3d *Accel,VecVector3d *Gyro)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  istream *piVar4;
  undefined1 auVar5 [16];
  Vector3d Gyro_temp;
  Vector3d Accel_temp;
  string line;
  long SOW;
  long week;
  ifstream in;
  uint auStack_3a0 [122];
  stringstream buff;
  ostream local_1a8 [376];
  
  std::ifstream::ifstream((string *)&in);
  std::ifstream::open((string *)&in,(_Ios_Openmode)DataFile);
  lVar3 = *(long *)(_in + -0x18);
  uVar1 = *(uint *)((long)auStack_3a0 + lVar3);
  if ((uVar1 & 5) == 0) {
    while ((*(byte *)((long)auStack_3a0 + lVar3) & 2) == 0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream((stringstream *)&buff);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&line)
      ;
      if (*line._M_dataplus._M_p != 'm') {
        std::operator<<(local_1a8,(string *)&line);
        piVar4 = std::istream::_M_extract<long>((long *)&buff);
        piVar4 = std::istream::_M_extract<long>((long *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        piVar4 = std::istream::_M_extract<double>((double *)piVar4);
        std::istream::_M_extract<double>((double *)piVar4);
        Accel_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = Accel_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[0] * 9.7936174;
        Accel_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = Accel_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[1] * 9.7936174;
        Accel_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = Accel_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                   .m_data.array[2] * -9.7936174;
        auVar5._0_8_ = Gyro_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[0] * (double)DAT_0012b9e0;
        auVar5._8_8_ = Gyro_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] * DAT_0012b9e0._8_8_;
        auVar5 = divpd(auVar5,_DAT_0012b9f0);
        Gyro_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array._0_16_ = divpd(auVar5,_DAT_0012b9e0);
        Gyro_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = ((Gyro_temp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[2] * -3600.0) / 206264.80624709636) / 3600.0;
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back(Accel,&Accel_temp);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::push_back(Gyro,&Gyro_temp);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&buff);
      std::__cxx11::string::~string((string *)&line);
      lVar3 = *(long *)(_in + -0x18);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"open file error");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ifstream::~ifstream(&in);
  return (uVar1 & 5) == 0;
}

Assistant:

bool ReadLinsData(const string DataFile, VecVector3d &Accel, VecVector3d &Gyro)
{
    ifstream in;
    in.open(DataFile);
    if(!in)
    {
        cout << "open file error" << endl;
        return false;
    }

    while(!in.eof())
    {
        string line;
        stringstream buff;
        getline(in, line);
        if(line[0] == 'm')
            continue;
        long int week, SOW;
        Vector3d Accel_temp, Gyro_temp;

        buff << line;
        buff >> week >> SOW >> Gyro_temp[1] >> Gyro_temp[0] >> Gyro_temp[2]
             >> Accel_temp[1] >> Accel_temp[0] >> Accel_temp[2];

        Accel_temp[0] = (Accel_temp[0] * GRAVITY);
        Accel_temp[1] = (Accel_temp[1] * GRAVITY);
        Accel_temp[2] = -(Accel_temp[2] * GRAVITY);
        
        Gyro_temp[0] = Deg2Rad((Gyro_temp[0])) / 3600.0;
        Gyro_temp[1] = Deg2Rad((Gyro_temp[1])) / 3600.0;
        Gyro_temp[2] = Deg2Rad(-(Gyro_temp[2])) / 3600.0;

        Accel.push_back(Accel_temp);
        Gyro.push_back(Gyro_temp);
    }

    return true;
}